

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tradedbook.cpp
# Opt level: O1

void __thiscall hedg::Traded_Book::Traded_Book(Traded_Book *this)

{
  int i;
  long lVar1;
  atomic<hedg::Bid> aVar2;
  uint uVar3;
  ulong uVar4;
  float fVar5;
  
  lVar1 = 0;
  do {
    *(undefined8 *)((long)&this->book[0]._M_i.price + lVar1) = 0;
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0xaf0);
  this->ticks[4] = 0.2;
  this->ticks[5] = 0.5;
  this->ticks[6] = 1.0;
  this->ticks[7] = 2.0;
  this->ticks[0] = 0.01;
  this->ticks[1] = 0.02;
  this->ticks[2] = 0.05;
  this->ticks[3] = 0.1;
  this->ticks[8] = 5.0;
  this->ticks[9] = 10.0;
  this->indexes[0] = 1;
  this->indexes[1] = 100;
  this->indexes[2] = 0x96;
  this->indexes[3] = 0xaa;
  this->indexes[4] = 0xbe;
  this->indexes[5] = 0xd2;
  this->indexes[6] = 0xe6;
  this->indexes[7] = 0xf0;
  this->indexes[8] = 0xfa;
  this->indexes[9] = 0x104;
  LOCK();
  (this->max_price)._M_i = 1.1754944e-38;
  UNLOCK();
  LOCK();
  (this->min_price)._M_i = 3.4028235e+38;
  UNLOCK();
  LOCK();
  (this->max_size)._M_i = 1.1754944e-38;
  UNLOCK();
  LOCK();
  (this->min_size)._M_i = 3.4028235e+38;
  UNLOCK();
  LOCK();
  (this->min_price_idx).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->max_price_idx).super___atomic_base<int>._M_i = -1;
  UNLOCK();
  LOCK();
  (this->max_traded_price_idx).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->min_traded_price_idx).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  lVar1 = 0;
  fVar5 = 1.01;
  uVar3 = 0;
  do {
    if ((((((fVar5 < 1.0) || (uVar4 = 0, 2.0 <= fVar5)) &&
          ((fVar5 < 2.0 || (uVar4 = 1, 3.0 <= fVar5)))) &&
         ((fVar5 < 3.0 || (uVar4 = 2, 4.0 <= fVar5)))) &&
        ((fVar5 < 4.0 || (uVar4 = 3, 6.0 <= fVar5)))) &&
       (((((fVar5 < 6.0 || (uVar4 = 4, 10.0 <= fVar5)) &&
          ((fVar5 < 10.0 || (uVar4 = 5, 20.0 <= fVar5)))) &&
         ((fVar5 < 20.0 || (uVar4 = 6, 30.0 <= fVar5)))) &&
        (((fVar5 < 30.0 || (uVar4 = 7, 50.0 <= fVar5)) &&
         ((fVar5 < 50.0 || (uVar4 = 8, 100.0 <= fVar5)))))))) {
      uVar4 = (ulong)uVar3;
      if (fVar5 < 1000.0) {
        uVar4 = 9;
      }
      if (fVar5 < 100.0) {
        uVar4 = (ulong)uVar3;
      }
    }
    fVar5 = (float)(int)(fVar5 * 100.0 + 0.5) / 100.0;
    aVar2._M_i.size = 0.0;
    aVar2._M_i.price = fVar5;
    LOCK();
    this->book[lVar1]._M_i = aVar2._M_i;
    UNLOCK();
    uVar3 = (uint)uVar4;
    fVar5 = fVar5 + this->ticks[uVar4];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x15e);
  return;
}

Assistant:

Traded_Book::Traded_Book() {

	max_price.store(std::numeric_limits<float>::min());
	min_price.store(std::numeric_limits<float>::max());
	max_size.store(std::numeric_limits<float>::min());
	min_size.store(std::numeric_limits<float>::max());
	min_price_idx.store(0);
	max_price_idx.store(-1);
	max_traded_price_idx.store(0);
	min_traded_price_idx.store(0);

	float x = 1.01;
	int space = 0;
	for (int i = 0, t_idx = 0; i < 350; ++i) {

		if (1 <= x && x < 2)
			t_idx = 0;
		else if (2 <= x && x < 3)
			t_idx = 1;
		else if (3 <= x && x < 4)
			t_idx = 2;
		else if (4 <= x && x < 6)
			t_idx = 3;
		else if (6 <= x && x < 10)
			t_idx = 4;
		else if (10 <= x && x < 20)
			t_idx = 5;
		else if (20 <= x && x < 30)
			t_idx = 6;
		else if (30 <= x && x < 50)
			t_idx = 7;
		else if (50 <= x && x < 100)
			t_idx = 8;
		else if (100 <= x && x < 1000)
			t_idx = 9;

		x = round_2dp(x);
		book[i].store(Bid(x, 0));
		x += ticks[t_idx];
	}
}